

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::MarkTempProcessInstr(BackwardPass *this,Instr *instr)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  BasicBlock *block;
  Instr *instr_local;
  BackwardPass *this_local;
  
  bVar3 = IsCollectionPass(this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x192d,"(!IsCollectionPass())","!IsCollectionPass()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((*(ushort *)&this->currentBlock->field_0x18 >> 1 & 1) == 0) {
    pBVar1 = this->currentBlock;
    bVar3 = DoMarkTempNumbers(this);
    if (bVar3) {
      NumberTemp::ProcessInstr(&pBVar1->tempNumberTracker->super_NumberTemp,instr,this);
    }
    bVar3 = DoMarkTempObjects(this);
    if (bVar3) {
      ObjectTemp::ProcessInstr(instr);
    }
    bVar3 = DoMarkTempObjectVerify(this);
    if (bVar3) {
      ObjectTempVerify::ProcessInstr
                (&pBVar1->tempObjectVerifyTracker->super_ObjectTempVerify,instr,this);
    }
  }
  return;
}

Assistant:

void
BackwardPass::MarkTempProcessInstr(IR::Instr * instr)
{
    Assert(!IsCollectionPass());

    if (this->currentBlock->isDead)
    {
        return;
    }

    BasicBlock * block;
    block = this->currentBlock;
    if (this->DoMarkTempNumbers())
    {
        block->tempNumberTracker->ProcessInstr(instr, this);
    }

    if (this->DoMarkTempObjects())
    {
        block->tempObjectTracker->ProcessInstr(instr);
    }

#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        block->tempObjectVerifyTracker->ProcessInstr(instr, this);
    }
#endif
}